

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>,unsigned_int>
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  uint uVar1;
  stored_size_type sVar2;
  pointer ppEVar3;
  _Rb_tree_const_iterator<unsigned_int> __first1;
  bool bVar4;
  pointer bg;
  _Bit_type *p_Var5;
  node_ptr next;
  ulong uVar6;
  uint uVar7;
  node_ptr n;
  pointer ppEVar8;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __first2;
  Entry entry;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_228;
  undefined **local_1f8;
  ulong local_1f0;
  shared_count sStack_1e8;
  pointer *local_1e0;
  _Rb_tree_node_base local_1d8;
  pointer local_1b8;
  char *local_1b0;
  shared_count sStack_1a8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  size_t local_130;
  size_t local_128;
  size_t *local_120;
  size_t *local_118;
  char *local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>>
            ((column_content<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL>_>_>
              *)&local_228,col);
  if (local_228._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    __first1._M_node._4_4_ = local_228._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
    __first1._M_node._0_4_ = (uint)local_228._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                      (__first1,(_Base_ptr)((long)&local_228 + 8),
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_1d8._M_color._0_1_ = bVar4;
  local_1d8._M_parent = (_Base_ptr)0x0;
  local_1d8._M_left = (_Base_ptr)0x0;
  local_1b8 = (pointer)0x1ecd18;
  local_1b0 = "";
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_0022e388;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_1e0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8._M_left);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_228);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  uVar7 = (*(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          *(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
          (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar7 < 0) {
    sVar2 = (col->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar2 == 0) {
      local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_228._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
      local_228._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
      local_228._M_impl._0_8_ = (_Bit_type *)0x0;
      local_228._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_228._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      goto LAB_0012f20d;
    }
    uVar7 = (col->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
            .super_type.m_holder.m_start[sVar2 - 1]->rowIndex_ + 1;
  }
  local_1f8 = (undefined **)((ulong)local_1f8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_228,(long)(int)uVar7,(bool *)&local_1f8,
             (allocator_type *)&local_1b8);
  if ((col->column_).
      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
      .super_type.m_holder.m_size != 0) {
    ppEVar3 = (col->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    ppEVar8 = ppEVar3;
    do {
      if (ppEVar8 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, true>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, false, true>>> **, IsConst = true]"
                     );
      }
      uVar1 = (*ppEVar8)->rowIndex_;
      if (uVar7 <= uVar1) break;
      *(ulong *)(local_228._M_impl._0_8_ + (ulong)(uVar1 >> 6) * 8) =
           *(ulong *)(local_228._M_impl._0_8_ + (ulong)(uVar1 >> 6) * 8) |
           1L << ((byte)uVar1 & 0x3f);
      ppEVar8 = ppEVar8 + 1;
    } while (ppEVar8 !=
             ppEVar3 + (col->column_).
                       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                       .super_type.m_holder.m_size);
  }
LAB_0012f20d:
  __last1.super__Bit_iterator_base._M_offset =
       (uint)local_228._M_impl.super__Rb_tree_header._M_header._M_left;
  __last1.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(uint)local_228._M_impl.super__Rb_tree_header._M_header._M_left +
      ((long)local_228._M_impl.super__Rb_tree_header._M_header._M_parent - local_228._M_impl._0_8_)
      * 8 == (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var5)
             * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_228._M_impl._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = p_Var5;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  local_1d8._M_color._0_1_ = bVar4;
  local_1d8._M_parent = (_Base_ptr)0x0;
  local_1d8._M_left = (_Base_ptr)0x0;
  local_1b8 = (pointer)0x1ecd49;
  local_1b0 = "";
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_0022e388;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_1e0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_90,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8._M_left);
  if ((_Bit_type *)local_228._M_impl._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_228._M_impl._0_8_,
                    (long)local_228._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_228._M_impl._0_8_);
    local_228._M_impl._0_8_ = (_Bit_type *)0x0;
    local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
    local_228._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x120);
  local_1d8._M_parent = (_Base_ptr)((ulong)local_1d8._M_parent & 0xffffffffffffff00);
  local_1d8._0_8_ = &PTR__lazy_ostream_0022e440;
  local_1d8._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1d8._M_right = (_Base_ptr)0x1ec196;
  local_128 = (col->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_118 = &local_128;
  local_130 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8 = (pointer)CONCAT71(local_1b8._1_7_,local_128 == local_130);
  local_120 = &local_130;
  local_1b0 = (char *)0x0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_1a0 = (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)0x1ecca4;
  local_198 = "";
  local_228._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_118;
  local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_228._M_impl._0_8_ = &PTR__lazy_ostream_0022e400;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = (pointer *)&local_120;
  local_1f0 = local_1f0 & 0xffffffffffffff00;
  local_1f8 = &PTR__lazy_ostream_0022e400;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_1d8,&local_1a0,0x120,1,2,2,"col.size()",&local_228,"setcont.size()",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  if (((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x124);
    local_1f8 = (undefined **)
                CONCAT71(local_1f8._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size == 0);
    local_1f0 = 0;
    sStack_1e8.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "col.is_empty()";
    local_1d8._M_parent = (_Base_ptr)0x1ecd9d;
    local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_228._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_d8 = "";
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_100 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x126);
    local_1f8 = (undefined **)
                CONCAT71(local_1f8._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size != 0);
    local_1f0 = 0;
    sStack_1e8.pi_ = (sp_counted_base *)0x0;
    local_1d8._0_8_ = "!col.is_empty()";
    local_1d8._M_parent = (_Base_ptr)0x1ecd9d;
    local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_228._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
    local_228._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_108 = (_Base_ptr)0x1ecd17;
    local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var5) * 8 +
      (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    uVar7 = 1;
    uVar6 = 0;
    do {
      if ((p_Var5[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x12a,
                   &local_150);
        local_228._M_impl._0_4_ = 0xffffffff;
        local_228._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1d8._0_8_ =
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
             .super_type.m_holder.m_start;
        local_1b8 = (pointer)(local_1d8._0_8_ +
                             (col->column_).
                             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                             .super_type.m_holder.m_size * 8);
        local_1a0 = &local_228;
        local_228._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = uVar7 - 1;
        bVar4 = std::
                binary_search<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>**,true>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*)_1_>
                          (&local_1d8,&local_1b8,&local_1a0);
        if (local_228._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
          (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color =
               local_228._M_impl.super__Rb_tree_header._M_header._M_color;
          *(undefined4 *)&(local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x4 =
               local_228._M_impl.super__Rb_tree_header._M_header._4_4_;
          *(_Base_ptr *)(local_228._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
               local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_228._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        }
        local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,!bVar4);
        local_1f0 = 0;
        sStack_1e8.pi_ = (sp_counted_base *)0x0;
        local_1d8._0_8_ = "!col.is_non_zero(i)";
        local_1d8._M_parent = (_Base_ptr)0x1ecdb1;
        local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_228._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
        boost::test_tools::tt_detail::report_assertion(&local_1f8,&local_228,&local_160,0x12a,1,0,0)
        ;
      }
      else {
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_180 = &boost::unit_test::basic_cstring<char_const>::null;
        local_178 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,300,&local_180)
        ;
        local_228._M_impl._0_4_ = 0xffffffff;
        local_228._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1d8._0_8_ =
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
             .super_type.m_holder.m_start;
        local_1b8 = (pointer)(local_1d8._0_8_ +
                             (col->column_).
                             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_void,_void>
                             .super_type.m_holder.m_size * 8);
        local_1a0 = &local_228;
        local_228._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = uVar7 - 1;
        bVar4 = std::
                binary_search<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>**,true>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*)_1_>
                          (&local_1d8,&local_1b8,&local_1a0);
        if (local_228._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
          (local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color =
               local_228._M_impl.super__Rb_tree_header._M_header._M_color;
          *(undefined4 *)&(local_228._M_impl.super__Rb_tree_header._M_header._M_parent)->field_0x4 =
               local_228._M_impl.super__Rb_tree_header._M_header._4_4_;
          *(_Base_ptr *)(local_228._M_impl.super__Rb_tree_header._M_header._0_8_ + 8) =
               local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
          local_228._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
        }
        local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar4);
        local_1f0 = 0;
        sStack_1e8.pi_ = (sp_counted_base *)0x0;
        local_1d8._0_8_ = "col.is_non_zero(i)";
        local_1d8._M_parent = (_Base_ptr)0x1ecdb1;
        local_228._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_228._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_228._M_impl._0_8_ = &PTR__lazy_ostream_0022e388;
        local_228._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_190 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_188 = "";
        local_228._M_impl.super__Rb_tree_header._M_header._M_left = &local_1d8;
        boost::test_tools::tt_detail::report_assertion(&local_1f8,&local_228,&local_190,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1e8);
      uVar6 = (ulong)uVar7;
      p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar7 = uVar7 + 1;
    } while (uVar6 < (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)p_Var5) * 8);
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}